

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O2

bool __thiscall QNetworkCookie::operator==(QNetworkCookie *this,QNetworkCookie *other)

{
  QNetworkCookiePrivate *pQVar1;
  QNetworkCookiePrivate *pQVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  QDateTime aQStack_38 [8];
  QDateTime local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar3 = true;
    goto LAB_0017e865;
  }
  bVar3 = ::operator==(&pQVar2->name,&pQVar1->name);
  if (bVar3) {
    bVar3 = ::operator==(&((this->d).d.ptr)->value,&((other->d).d.ptr)->value);
    if (bVar3) {
      QDateTime::toUTC();
      QDateTime::toUTC();
      cVar4 = QDateTime::equals(local_30);
      if (cVar4 == '\0') {
LAB_0017e851:
        bVar3 = false;
      }
      else {
        bVar3 = comparesEqual(&((this->d).d.ptr)->domain,&((other->d).d.ptr)->domain);
        if (!bVar3) goto LAB_0017e851;
        bVar3 = comparesEqual(&((this->d).d.ptr)->path,&((other->d).d.ptr)->path);
        if (!bVar3) goto LAB_0017e851;
        pQVar1 = (this->d).d.ptr;
        pQVar2 = (other->d).d.ptr;
        if (pQVar1->secure != pQVar2->secure) goto LAB_0017e851;
        bVar3 = comparesEqual(&pQVar1->comment,&pQVar2->comment);
        if (!bVar3) goto LAB_0017e851;
        bVar3 = ((this->d).d.ptr)->sameSite == ((other->d).d.ptr)->sameSite;
      }
      QDateTime::~QDateTime(aQStack_38);
      QDateTime::~QDateTime(local_30);
      goto LAB_0017e865;
    }
  }
  bVar3 = false;
LAB_0017e865:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookie::operator==(const QNetworkCookie &other) const
{
    if (d == other.d)
        return true;
    return d->name == other.d->name &&
        d->value == other.d->value &&
        d->expirationDate.toUTC() == other.d->expirationDate.toUTC() &&
        d->domain == other.d->domain &&
        d->path == other.d->path &&
        d->secure == other.d->secure &&
        d->comment == other.d->comment &&
        d->sameSite == other.d->sameSite;
}